

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap.h
# Opt level: O2

size_t __thiscall
phmap::priv::
parallel_hash_set<4ul,phmap::priv::raw_hash_set,std::mutex,phmap::priv::FlatHashMapPolicy<std::__cxx11::string,int>,phmap::priv::StatefulTestingHash,phmap::priv::StatefulTestingEqual,phmap::priv::Alloc<std::pair<std::__cxx11::string_const,int>>>
::count<std::__cxx11::string>
          (parallel_hash_set<4ul,phmap::priv::raw_hash_set,std::mutex,phmap::priv::FlatHashMapPolicy<std::__cxx11::string,int>,phmap::priv::StatefulTestingHash,phmap::priv::StatefulTestingEqual,phmap::priv::Alloc<std::pair<std::__cxx11::string_const,int>>>
           *this,key_arg<std::__cxx11::basic_string<char>_> *key)

{
  const_iterator local_38;
  
  find<std::__cxx11::string>(&local_38,this,key);
  return (ulong)(local_38.iter_.inner_ != (Inner *)0x0);
}

Assistant:

size_t count(const key_arg<K>& key) const {
        return find(key) == end() ? 0 : 1;
    }